

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

int prvTidytmbstrncasecmp(ctmbstr s1,ctmbstr s2,uint n)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint local_24;
  uint c;
  uint n_local;
  ctmbstr s2_local;
  ctmbstr s1_local;
  
  local_24 = n;
  _c = s2;
  s2_local = s1;
  while( true ) {
    cVar1 = *s2_local;
    uVar2 = prvTidyToLower((int)cVar1);
    uVar3 = prvTidyToLower((int)*_c);
    if (uVar2 != uVar3) {
      if (local_24 == 0) {
        s1_local._4_4_ = 0;
      }
      else {
        s1_local._4_4_ = -1;
        if (*_c < *s2_local) {
          s1_local._4_4_ = 1;
        }
      }
      return s1_local._4_4_;
    }
    if ((int)cVar1 == 0) break;
    if (local_24 == 0) {
      return 0;
    }
    s2_local = s2_local + 1;
    _c = _c + 1;
    local_24 = local_24 - 1;
  }
  return 0;
}

Assistant:

int TY_(tmbstrncasecmp)( ctmbstr s1, ctmbstr s2, uint n )
{
    uint c;

    while (c = (uint)(*s1), TY_(ToLower)(c) == TY_(ToLower)((uint)(*s2)))
    {
        if (c == '\0')
            return 0;

        if (n == 0)
            return 0;

        ++s1;
        ++s2;
        --n;
    }

    if (n == 0)
        return 0;

    return (*s1 > *s2 ? 1 : -1);
}